

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildTestDyndepTwoLevelDiscoveredReady::Run(BuildTestDyndepTwoLevelDiscoveredReady *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  Builder *this_01;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  string err;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule touch\n  command = touch $out\nrule cp\n  command = cp $in $out\nbuild dd0: cp dd0-in\nbuild dd1: cp dd1-in\nbuild in: touch\nbuild tmp: touch || dd0\n  dyndep = dd0\nbuild out: touch || dd1\n  dyndep = dd1\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd1-in",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"ninja_dyndep_version = 1\nbuild out: dyndep | tmp\n",&local_69);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd0-in",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_69);
    VirtualFileSystem::Create(this_00,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd0",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"ninja_dyndep_version = 1\nbuild tmp: dyndep | in\n",&local_69);
    VirtualFileSystem::Create(this_00,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    piVar1 = &(this->super_BuildTest).fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"out",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_69);
    VirtualFileSystem::Create(this_00,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    pTVar3 = g_current_test;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out",&local_6a);
    this_01 = &(this->super_BuildTest).builder_;
    pNVar5 = Builder::AddTarget(this_01,&local_48,&local_68);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0xcb5,"builder_.AddTarget(\"out\", &err)");
    std::__cxx11::string::~string((string *)&local_48);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_68);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0xcb6,"\"\" == err");
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_68);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0xcb8,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_68);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0xcb9,"\"\" == err");
    bVar4 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_BuildTest).command_runner_.commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_BuildTest).command_runner_.commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x80,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0xcba,"4u == command_runner_.commands_ran_.size()");
    pTVar3 = g_current_test;
    if (bVar4) {
      bVar4 = std::operator==("cp dd1-in dd1",
                              (this->super_BuildTest).command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xcbb,"\"cp dd1-in dd1\" == command_runner_.commands_ran_[0]");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("touch in",
                              (this->super_BuildTest).command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xcbc,"\"touch in\" == command_runner_.commands_ran_[1]");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("touch tmp",
                              (this->super_BuildTest).command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xcbd,"\"touch tmp\" == command_runner_.commands_ran_[2]");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("touch out",
                              (this->super_BuildTest).command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 3);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xcbe,"\"touch out\" == command_runner_.commands_ran_[3]");
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildTest, DyndepTwoLevelDiscoveredReady) {
  // Verify that a dyndep file can discover a new input whose
  // edge also has a dyndep file that is ready to load immediately.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd0: cp dd0-in\n"
"build dd1: cp dd1-in\n"
"build in: touch\n"
"build tmp: touch || dd0\n"
"  dyndep = dd0\n"
"build out: touch || dd1\n"
"  dyndep = dd1\n"
  ));
  fs_.Create("dd1-in",
"ninja_dyndep_version = 1\n"
"build out: dyndep | tmp\n"
);
  fs_.Create("dd0-in", "");
  fs_.Create("dd0",
"ninja_dyndep_version = 1\n"
"build tmp: dyndep | in\n"
);
  fs_.Tick();
  fs_.Create("out", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(4u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cp dd1-in dd1", command_runner_.commands_ran_[0]);
  EXPECT_EQ("touch in", command_runner_.commands_ran_[1]);
  EXPECT_EQ("touch tmp", command_runner_.commands_ran_[2]);
  EXPECT_EQ("touch out", command_runner_.commands_ran_[3]);
}